

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::nonfinite_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          nonfinite_writer<wchar_t> *f)

{
  undefined8 *puVar1;
  byte bVar2;
  sign_t sVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  fill_t<wchar_t> *fill;
  size_t n;
  int *piVar9;
  
  sVar3 = f->sign;
  uVar8 = 4 - (ulong)(sVar3 == none);
  n = (uint)specs->width - uVar8;
  if ((uint)specs->width < uVar8 || n == 0) {
    puVar1 = *(undefined8 **)this;
    lVar6 = puVar1[2];
    uVar8 = uVar8 + lVar6;
    if ((ulong)puVar1[3] < uVar8) {
      (**(code **)*puVar1)(puVar1,uVar8);
      sVar3 = f->sign;
    }
    puVar1[2] = uVar8;
    piVar9 = (int *)(lVar6 * 4 + puVar1[1]);
    if (sVar3 != none) {
      *piVar9 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)sVar3);
      piVar9 = piVar9 + 1;
    }
    pcVar4 = f->str;
    uVar8 = 4;
    lVar6 = 0;
    do {
      piVar9[lVar6] = (int)pcVar4[lVar6];
      uVar8 = uVar8 - 1;
      lVar6 = lVar6 + 1;
    } while (1 < uVar8);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar6 = puVar1[2];
  uVar8 = uVar8 + lVar6 + (specs->fill).size_ * n;
  if ((ulong)puVar1[3] < uVar8) {
    (**(code **)*puVar1)(puVar1,uVar8);
  }
  puVar1[2] = uVar8;
  pwVar7 = (wchar_t *)(lVar6 * 4 + puVar1[1]);
  fill = &specs->fill;
  bVar2 = specs->field_0x9 & 0xf;
  if (bVar2 == 3) {
    uVar8 = n >> 1 & 0x7fffffff;
    pwVar7 = fill<wchar_t*,wchar_t>(pwVar7,uVar8,fill);
    if ((ulong)f->sign != 0) {
      *pwVar7 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pwVar7 = pwVar7 + 1;
    }
    pcVar4 = f->str;
    uVar5 = 4;
    do {
      *pwVar7 = (int)*pcVar4;
      pcVar4 = pcVar4 + 1;
      pwVar7 = pwVar7 + 1;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    n = n - uVar8;
  }
  else {
    if (bVar2 == 2) {
      pwVar7 = fill<wchar_t*,wchar_t>(pwVar7,n,fill);
      if ((ulong)f->sign != 0) {
        *pwVar7 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        pwVar7 = pwVar7 + 1;
      }
      pcVar4 = f->str;
      uVar8 = 4;
      lVar6 = 0;
      do {
        pwVar7[lVar6] = (int)pcVar4[lVar6];
        uVar8 = uVar8 - 1;
        lVar6 = lVar6 + 1;
      } while (1 < uVar8);
      return;
    }
    if ((ulong)f->sign != 0) {
      *pwVar7 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pwVar7 = pwVar7 + 1;
    }
    pcVar4 = f->str;
    uVar8 = 4;
    do {
      *pwVar7 = (int)*pcVar4;
      pcVar4 = pcVar4 + 1;
      pwVar7 = pwVar7 + 1;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  fill<wchar_t*,wchar_t>(pwVar7,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }